

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Value * __thiscall
GlobOpt::ValueNumberDst(GlobOpt *this,Instr **pInstr,Value *src1Val,Value *src2Val)

{
  BVSparse<Memory::JitArenaAllocator> **ppBVar1;
  OpCode OVar2;
  undefined2 uVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar4;
  BVIndex i;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  BasicBlock *pBVar5;
  ObjectSymInfo *pOVar6;
  PropertySym *pPVar7;
  ValueInfo *valueInfo;
  Sym *pSVar8;
  code *pcVar9;
  bool bVar10;
  OpndKind OVar11;
  BOOLEAN BVar12;
  bool bVar13;
  ValueType VVar14;
  BailOutKind BVar15;
  uint uVar16;
  uint sourceContextId;
  uint functionId;
  SymOpnd *pSVar17;
  IntConstantBounds IVar18;
  StackSym *pSVar19;
  Value *pVVar20;
  ValueType *pVVar21;
  RegOpnd *pRVar22;
  ProfiledInstr *pPVar23;
  IndirOpnd *pIVar24;
  undefined4 *puVar25;
  Instr *pIVar26;
  GlobOpt *this_01;
  GlobOpt *pGVar27;
  BailOutKind bailOutKind;
  GlobOpt *pGVar28;
  GlobOpt *this_02;
  Opnd *pOVar29;
  BVSparse<Memory::JitArenaAllocator> **ppBVar30;
  PropertySym **ppPVar31;
  Instr **ppIVar32;
  uint local_7c;
  BVSparse<Memory::JitArenaAllocator> *local_78;
  int local_6c;
  int local_68;
  int32 min2;
  int32 max2;
  int32 max1;
  Value *local_58;
  uint local_4c;
  Instr **ppIStack_48;
  int32 min1;
  undefined1 local_40 [8];
  ValueType profiledValueType;
  
  pGVar27 = (GlobOpt *)(*pInstr)->m_dst;
  local_58 = src2Val;
  bVar10 = IR::Instr::CallsSetter(*pInstr);
  if (pGVar27 == (GlobOpt *)0x0 || bVar10) {
    return (Value *)0x0;
  }
  OVar11 = IR::Opnd::GetKind((Opnd *)pGVar27);
  ppIStack_48 = pInstr;
  if (OVar11 == OpndKindReg) {
    pRVar22 = IR::Opnd::AsRegOpnd((Opnd *)pGVar27);
    pSVar19 = pRVar22->m_sym;
    bVar10 = OpCodeAttr::TempNumberProducing((*pInstr)->m_opcode);
    if (bVar10) {
      pGVar28 = (GlobOpt *)(this->currentBlock->globOptData).isTempSrc;
      BVSparse<Memory::JitArenaAllocator>::Set
                ((BVSparse<Memory::JitArenaAllocator> *)pGVar28,(pSVar19->super_Sym).m_id);
      pVVar20 = local_58;
    }
    else {
      bVar10 = OpCodeAttr::TempNumberTransfer((*pInstr)->m_opcode);
      if (bVar10) {
        pOVar29 = (*pInstr)->m_src1;
        _profiledValueType = this;
        bVar10 = IR::Opnd::IsRegOpnd(pOVar29);
        this = _profiledValueType;
        if (bVar10) {
          this_00 = (_profiledValueType->currentBlock->globOptData).isTempSrc;
          pRVar22 = IR::Opnd::AsRegOpnd(pOVar29);
          BVar12 = BVSparse<Memory::JitArenaAllocator>::Test
                             (this_00,(pRVar22->m_sym->super_Sym).m_id);
          this = _profiledValueType;
          if (BVar12 != '\0') {
            pRVar22 = IR::Opnd::AsRegOpnd(pOVar29);
            pVVar20 = local_58;
            pIVar26 = (pRVar22->m_sym->field_5).m_instrDef;
            if ((((pIVar26 != (Instr *)0x0 & pRVar22->m_sym->field_0x18) == 1) &&
                (OVar2 = pIVar26->m_opcode, OVar2 != Add_A)) &&
               (bVar10 = OpCodeAttr::TempNumberProducing(OVar2), this = _profiledValueType, bVar10))
            {
              pGVar28 = (GlobOpt *)(_profiledValueType->currentBlock->globOptData).isTempSrc;
              BVSparse<Memory::JitArenaAllocator>::Set
                        ((BVSparse<Memory::JitArenaAllocator> *)pGVar28,(pSVar19->super_Sym).m_id);
            }
            else {
              this = _profiledValueType;
              local_78 = (_profiledValueType->currentBlock->globOptData).isTempSrc;
              pRVar22 = IR::Opnd::AsRegOpnd(pOVar29);
              BVSparse<Memory::JitArenaAllocator>::Clear(local_78,(pRVar22->m_sym->super_Sym).m_id);
              pGVar28 = (GlobOpt *)(this->currentBlock->globOptData).isTempSrc;
              BVSparse<Memory::JitArenaAllocator>::Clear
                        ((BVSparse<Memory::JitArenaAllocator> *)pGVar28,(pSVar19->super_Sym).m_id);
            }
            goto LAB_00429417;
          }
        }
      }
      pGVar28 = (GlobOpt *)(this->currentBlock->globOptData).isTempSrc;
      BVSparse<Memory::JitArenaAllocator>::Clear
                ((BVSparse<Memory::JitArenaAllocator> *)pGVar28,(pSVar19->super_Sym).m_id);
      pVVar20 = local_58;
    }
  }
  else {
    if (OVar11 != OpndKindSym) {
      return (Value *)0x0;
    }
    pGVar28 = pGVar27;
    pSVar17 = IR::Opnd::AsSymOpnd((Opnd *)pGVar27);
    pSVar19 = (StackSym *)pSVar17->m_sym;
    pVVar20 = local_58;
  }
LAB_00429417:
  ppIVar32 = ppIStack_48;
  if (src1Val == (Value *)0x0) {
    this_02 = (GlobOpt *)0x0;
  }
  else {
    this_02 = (GlobOpt *)src1Val->valueInfo;
  }
  if (pVVar20 == (Value *)0x0) {
    this_01 = (GlobOpt *)0x0;
  }
  else {
    this_01 = (GlobOpt *)pVVar20->valueInfo;
  }
  pIVar26 = *ppIStack_48;
  OVar2 = pIVar26->m_opcode;
  _max2 = src1Val;
  _profiledValueType = this;
  switch(OVar2) {
  case Incr_A:
  case Decr_A:
    ValueType::ValueType((ValueType *)local_40);
    src1Val = _max2;
    if (_max2 == (Value *)0x0) {
      local_40._0_2_ = (anon_union_2_4_ea848c7b_for_ValueType_13)0x208;
    }
    else {
      local_40._0_2_ = ValueType::ToDefiniteAnyNumber(&_max2->valueInfo->super_ValueType);
    }
    pGVar27 = _profiledValueType;
    ppIVar32 = ppIStack_48;
    aVar4.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetCanBeTaggedValue((ValueType *)local_40,true);
    pIVar26 = *ppIVar32;
    pVVar20 = local_58;
    goto LAB_0042a681;
  case Neg_A:
  case ApplyArgs:
  case ProfiledDiv_A:
  case ProfiledRem_A:
  case Expo_A:
  case Conv_Obj:
  case Ld_A_ReuseLoc:
  case LdLocalObj:
  case LdInnerScope:
  case ChkUndecl:
  case EnsureNoRootFld:
  case EnsureNoRootRedeclFld:
  case ScopedEnsureNoRedeclFld:
  case InitUndecl:
  case InitUndeclLetFld:
  case InitUndeclRootLetFld:
  case InitUndeclRootConstFld:
  case InitConstSlot:
  case InitLetFld:
  case InitRootLetFld:
  case InitConstFld:
  case InitRootConstFld:
  case InitClassMember:
  case ArgIn0:
  case ArgOut_A:
  case ProfiledArgOut_A:
  case ArgOut_ANonVar:
  case ArgOut_Env:
  case Delete_A:
  case ProfiledLdFld:
  case LdFld_ReuseLoc:
  case ProfiledLdFld_ReuseLoc:
  case LdLocalFld:
  case ProfiledLdLocalFld:
  case LdLocalFld_ReuseLoc:
  case ProfiledLdLocalFld_ReuseLoc:
  case ProfiledLdFldForTypeOf:
  case ProfiledLdFldForCallApplyTarget:
  case ProfiledLdRootFld:
  case ProfiledLdMethodFld:
  case ProfiledLdRootMethodFld:
  case ProfiledStFld:
  case ProfiledStRootFld:
  case StLocalFld:
  case ProfiledStLocalFld:
  case ProfiledStFldStrict:
  case ProfiledStRootFldStrict:
  case ProfiledInitFld:
  case InitLocalFld:
  case ProfiledInitLocalFld:
  case InitRootFld:
  case ProfiledInitRootFld:
  case DeleteFld:
  case DeleteRootFld:
  case DeleteFldStrict:
  case DeleteRootFldStrict:
    goto switchD_0042945f_caseD_28;
  case Not_A:
    if ((src1Val == (Value *)0x0) ||
       (bVar10 = ValueInfo::GetIntValMinMax
                           ((ValueInfo *)this_02,(int *)&local_4c,&min2,
                            (bool)((byte)(*(uint *)&this->field_0xf4 >> 9) & 1)), !bVar10)) {
      local_4c = 0x80000000;
      min2 = 0x7fffffff;
      uVar16 = 0x7fffffff;
      local_7c = 0x80000000;
    }
    else {
      uVar16 = ~local_4c;
      local_7c = ~min2;
    }
    local_40._0_4_ = local_7c;
    if ((int)uVar16 < (int)local_7c) {
      local_40._0_4_ = uVar16;
    }
    if ((int)local_7c < (int)uVar16) {
      local_7c = uVar16;
    }
    pIVar26 = *ppIStack_48;
    goto LAB_00429fb4;
  case Typeof:
  case TypeofElem:
switchD_0042945f_caseD_2a:
    pVVar21 = &ValueType::String;
    break;
  case Add_A:
    ValueType::ValueType((ValueType *)local_40);
    src1Val = _max2;
    if (_max2 == (Value *)0x0) {
LAB_0042a522:
      if ((pVVar20 == (Value *)0x0) ||
         (bVar10 = ValueType::IsString((ValueType *)&this_01->byteCodeConstantValueNumbersBv),
         !bVar10)) {
        ppIVar32 = ppIStack_48;
        if (src1Val == (Value *)0x0) {
LAB_0042a6d0:
          if ((local_58 == (Value *)0x0) ||
             (bVar10 = ValueType::IsLikelyString
                                 ((ValueType *)&this_01->byteCodeConstantValueNumbersBv), !bVar10))
          {
            bVar10 = ValueType::IsUninitialized((ValueType *)local_40);
            pGVar27 = _profiledValueType;
            if (!bVar10) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar25 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                  ,0x1403,"(valueType.IsUninitialized())",
                                  "valueType.IsUninitialized()");
              if (!bVar10) goto LAB_0042a898;
              *puVar25 = 0;
              pGVar27 = _profiledValueType;
            }
            goto LAB_0042a889;
          }
        }
        else {
          ppBVar30 = &this_02->byteCodeConstantValueNumbersBv;
          bVar10 = ValueType::IsNotString((ValueType *)ppBVar30);
          if ((bVar10) &&
             (bVar13 = local_58 != (Value *)0x0,
             bVar10 = ValueType::IsPrimitive((ValueType *)ppBVar30), bVar10 && bVar13)) {
            bVar10 = ValueType::IsNotString((ValueType *)&this_01->byteCodeConstantValueNumbersBv);
            if ((bVar10) &&
               (bVar10 = ValueType::IsPrimitive
                                   ((ValueType *)&this_01->byteCodeConstantValueNumbersBv), bVar10))
            {
              aVar4.field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::SetCanBeTaggedValue(&ValueType::Number,true);
              goto LAB_0042a6f3;
            }
          }
          bVar10 = ValueType::IsLikelyString((ValueType *)ppBVar30);
          if (!bVar10) goto LAB_0042a6d0;
        }
        pVVar21 = &ValueType::String;
LAB_0042a6ee:
        aVar4.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::ToLikely(pVVar21);
        goto LAB_0042a6f3;
      }
LAB_0042a534:
      local_40._0_2_ = (anon_union_2_4_ea848c7b_for_ValueType_13)0x800;
      pGVar27 = _profiledValueType;
      ppIVar32 = ppIStack_48;
    }
    else {
      ppBVar30 = &this_02->byteCodeConstantValueNumbersBv;
      bVar10 = ValueType::IsLikelyNumber((ValueType *)ppBVar30);
      if (!bVar10 || pVVar20 == (Value *)0x0) {
LAB_0042a50f:
        bVar10 = ValueType::IsString((ValueType *)ppBVar30);
        pVVar20 = local_58;
        if (!bVar10) goto LAB_0042a522;
        goto LAB_0042a534;
      }
      ppBVar1 = &this_01->byteCodeConstantValueNumbersBv;
      bVar10 = ValueType::IsLikelyNumber((ValueType *)ppBVar1);
      if (!bVar10) goto LAB_0042a50f;
      bVar10 = ValueType::IsLikelyInt((ValueType *)ppBVar30);
      if ((!bVar10) || (bVar10 = ValueType::IsLikelyInt((ValueType *)ppBVar1), !bVar10)) {
        bVar10 = ValueType::IsNumber((ValueType *)ppBVar30);
        pGVar27 = _profiledValueType;
        if ((bVar10) && (bVar10 = ValueType::IsNumber((ValueType *)ppBVar1), bVar10)) {
          bVar10 = ValueType::IsFloat((ValueType *)ppBVar30);
          ppIVar32 = ppIStack_48;
          if ((bVar10) || (bVar10 = ValueType::IsFloat((ValueType *)ppBVar1), bVar10)) {
            pVVar21 = &ValueType::Float;
          }
          else {
            pVVar21 = &ValueType::Number;
          }
          local_40._0_2_ = ValueType::SetCanBeTaggedValue(pVVar21,true);
        }
        else {
          bVar10 = ValueType::IsLikelyFloat((ValueType *)ppBVar30);
          ppIVar32 = ppIStack_48;
          if ((bVar10) || (bVar10 = ValueType::IsLikelyFloat((ValueType *)ppBVar1), bVar10)) {
            pVVar21 = &ValueType::Float;
          }
          else {
            pVVar21 = &ValueType::Number;
          }
          local_40._0_2_ = ValueType::ToLikely(pVVar21);
        }
        goto LAB_0042a889;
      }
      bVar10 = ValueType::IsLikelyTaggedInt((ValueType *)ppBVar30);
      if (bVar10) {
        bVar10 = ValueType::IsLikelyTaggedInt((ValueType *)ppBVar1);
      }
      else {
        bVar10 = false;
      }
      ppIVar32 = ppIStack_48;
      bVar13 = ValueType::IsNumber((ValueType *)ppBVar30);
      if ((!bVar13) || (bVar13 = ValueType::IsNumber((ValueType *)ppBVar1), !bVar13)) {
        VVar14 = ValueType::GetInt(bVar10);
        pVVar21 = (ValueType *)&local_4c;
        local_4c = CONCAT22(local_4c._2_2_,VVar14.field_0);
        goto LAB_0042a6ee;
      }
      aVar4.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetNumberAndLikelyInt(bVar10);
LAB_0042a6f3:
      local_40._0_2_ = aVar4.bits;
      pGVar27 = _profiledValueType;
    }
LAB_0042a889:
    pIVar26 = *ppIVar32;
    pVVar20 = local_58;
    aVar4 = (anon_union_2_4_ea848c7b_for_ValueType_13)local_40._0_2_;
    goto LAB_0042a681;
  case Div_A:
    VVar14 = GetDivValueType(this,pIVar26,src1Val,pVVar20,false);
    local_40._0_2_ = VVar14.field_0;
    bVar10 = ValueType::IsLikelyInt((ValueType *)local_40);
    if ((bVar10) || (bVar10 = ValueType::IsFloat((ValueType *)local_40), bVar10)) {
      aVar4.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetCanBeTaggedValue((ValueType *)local_40,true);
      pIVar26 = *ppIStack_48;
      pGVar27 = _profiledValueType;
      goto LAB_0042a681;
    }
  case Mul_A:
  case Rem_A:
  case Sub_A:
    ValueType::ValueType((ValueType *)local_40);
    src1Val = _max2;
    if (_max2 == (Value *)0x0) {
LAB_0042a63c:
      if ((pVVar20 == (Value *)0x0) ||
         (bVar10 = ValueType::IsLikelyFloat((ValueType *)&this_01->byteCodeConstantValueNumbersBv),
         !bVar10)) {
        pVVar21 = &ValueType::Number;
      }
      else {
LAB_0042a651:
        pVVar21 = &ValueType::Float;
      }
      aVar4.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetCanBeTaggedValue(pVVar21,true);
      local_40._0_2_ = aVar4.bits;
      ppIVar32 = ppIStack_48;
    }
    else {
      ppBVar30 = &this_02->byteCodeConstantValueNumbersBv;
      bVar10 = ValueType::IsLikelyInt((ValueType *)ppBVar30);
      if (!bVar10 || pVVar20 == (Value *)0x0) {
LAB_0042a629:
        bVar10 = ValueType::IsLikelyFloat((ValueType *)ppBVar30);
        pVVar20 = local_58;
        if (!bVar10) goto LAB_0042a63c;
        goto LAB_0042a651;
      }
      ppBVar1 = &this_01->byteCodeConstantValueNumbersBv;
      bVar10 = ValueType::IsLikelyInt((ValueType *)ppBVar1);
      if ((!bVar10) || ((*ppIStack_48)->m_opcode == Div_A)) goto LAB_0042a629;
      bVar10 = ValueType::IsLikelyTaggedInt((ValueType *)ppBVar30);
      if (bVar10) {
        bVar13 = ValueType::IsLikelyTaggedInt((ValueType *)ppBVar1);
        bVar10 = true;
        if (!bVar13) {
          bVar10 = (*ppIStack_48)->m_opcode == Rem_A;
        }
      }
      else {
        bVar10 = false;
      }
      ppIVar32 = ppIStack_48;
      bVar13 = ValueType::IsNumber((ValueType *)ppBVar30);
      if ((bVar13) && (bVar13 = ValueType::IsNumber((ValueType *)ppBVar1), bVar13)) {
        aVar4.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::GetNumberAndLikelyInt(bVar10);
      }
      else {
        VVar14 = ValueType::GetInt(bVar10);
        local_4c = CONCAT22(local_4c._2_2_,VVar14.field_0);
        aVar4.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::ToLikely((ValueType *)&local_4c);
      }
      local_40._0_2_ = aVar4.bits;
    }
    pIVar26 = *ppIVar32;
    pGVar27 = _profiledValueType;
    pVVar20 = local_58;
LAB_0042a681:
    pVVar20 = CreateDstUntransferredValue(pGVar27,(ValueType)aVar4.field_0,pIVar26,src1Val,pVVar20);
    return pVVar20;
  case And_A:
  case Or_A:
  case Xor_A:
  case Shl_A:
  case Shr_A:
  case ShrU_A:
    if ((src1Val == (Value *)0x0) ||
       (bVar10 = ValueInfo::GetIntValMinMax
                           ((ValueInfo *)this_02,(int *)&local_4c,&min2,
                            (bool)((byte)(*(uint *)&this->field_0xf4 >> 9) & 1)), pGVar28 = this_02,
       !bVar10)) {
      local_4c = 0x80000000;
      min2 = 0x7fffffff;
    }
    ppIVar32 = ppIStack_48;
    if ((pVVar20 == (Value *)0x0) ||
       (bVar10 = ValueInfo::GetIntValMinMax
                           ((ValueInfo *)this_01,&local_6c,&local_68,
                            (bool)((byte)(*(uint *)&_profiledValueType->field_0xf4 >> 9) & 1)),
       pGVar28 = this_01, !bVar10)) {
      local_6c = -0x80000000;
      local_68 = 0x7fffffff;
    }
    pIVar26 = *ppIVar32;
    if ((int)local_4c < 0 && pIVar26->m_opcode == ShrU_A) {
      pGVar28 = (GlobOpt *)local_40;
      IntConstantBounds::IntConstantBounds((IntConstantBounds *)pGVar28,local_6c,local_68);
      IVar18 = IntConstantBounds::And_0x1f((IntConstantBounds *)pGVar28);
      if (-1 < (long)IVar18 && IVar18.lowerBound < 1) {
        aVar4.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::SetCanBeTaggedValue(&ValueType::AnyNumber,true);
        pIVar26 = *ppIVar32;
        pGVar27 = _profiledValueType;
        pVVar20 = local_58;
        goto LAB_0042a681;
      }
      pIVar26 = *ppIVar32;
    }
    PropagateIntRangeBinary
              (pGVar28,pIVar26,local_4c,min2,local_6c,local_68,(int32 *)local_40,(int32 *)&local_7c)
    ;
    pIVar26 = *ppIVar32;
    this = _profiledValueType;
    pVVar20 = local_58;
LAB_00429fb4:
    pVVar20 = CreateDstUntransferredIntValue(this,local_40._0_4_,local_7c,pIVar26,src1Val,pVVar20);
    return pVVar20;
  case CmEq_A:
  case CmGe_A:
  case CmGt_A:
  case CmLt_A:
  case CmLe_A:
  case CmNeq_A:
  case CmSrEq_A:
  case CmSrNeq_A:
    goto switchD_0042945f_caseD_3b;
  case Conv_Num:
    bVar10 = ValueType::IsNumber((ValueType *)&this_02->byteCodeConstantValueNumbersBv);
    if (!bVar10) {
      VVar14 = ValueType::ToDefiniteAnyNumber((ValueType *)&this_02->byteCodeConstantValueNumbersBv)
      ;
      local_40._0_2_ = VVar14.field_0;
      bVar10 = true;
LAB_0042a502:
      aVar4.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetCanBeTaggedValue((ValueType *)local_40,bVar10);
      goto LAB_0042a49c;
    }
    pIVar26 = *ppIStack_48;
    goto switchD_00429a9f_caseD_9a;
  case Ld_A:
switchD_0042945f_caseD_45:
    goto LAB_00429e53;
  case LdC_A_Null:
    pVVar21 = &ValueType::Null;
    break;
  case LdFld:
  case LdFldForTypeOf:
  case LdFldForCallApplyTarget:
  case LdRootFld:
  case LdMethodFld:
  case LdRootMethodFld:
  case ScopedLdFld:
  case ScopedLdMethodFld:
switchD_0042945f_caseD_5e:
    if (pIVar26->m_kind == InstrKindProfiled) {
      pPVar23 = IR::Instr::AsProfiledInstr(pIVar26);
      local_40._0_2_ = (pPVar23->u).field_3.fldInfoData.f1;
      bVar10 = ValueType::IsLikelyInt((ValueType *)local_40);
      pGVar28 = _profiledValueType;
      if (((bVar10) && (bVar10 = IR::Opnd::IsRegOpnd((Opnd *)pGVar27), bVar10)) &&
         (pRVar22 = IR::Opnd::AsRegOpnd((Opnd *)pGVar27), (pRVar22->m_sym->field_0x18 & 2) != 0))
      goto LAB_00429b7f;
      if (this_02 == (GlobOpt *)0x0) goto LAB_00429b68;
      bVar10 = ValueType::IsUninitialized((ValueType *)&this_02->byteCodeConstantValueNumbersBv);
      if (!bVar10) goto LAB_00429b7f;
      if (pGVar28->prePassLoop == (Loop *)0x0) {
LAB_00429717:
        *(undefined2 *)&this_02->byteCodeConstantValueNumbersBv = local_40._0_2_;
        IR::Opnd::SetValueType((*ppIVar32)->m_src1,(ValueType)local_40._0_2_);
        goto LAB_00429b7f;
      }
      bVar10 = IR::Opnd::IsRegOpnd((Opnd *)pGVar27);
      if (bVar10) {
        pRVar22 = IR::Opnd::AsRegOpnd((Opnd *)pGVar27);
        if (((pRVar22->m_sym->field_0x18 & 1) != 0) &&
           ((pRVar22->m_sym->field_5).m_instrDef != (Instr *)0x0)) goto LAB_00429717;
      }
LAB_00429b68:
      pVVar20 = NewGenericValue(pGVar28,(ValueType)local_40._0_2_,(Opnd *)pGVar27);
      if (pVVar20 == (Value *)0x0) goto LAB_00429b7f;
    }
    else {
LAB_00429b7f:
      pVVar20 = ValueNumberTransferDst(_profiledValueType,*ppIVar32,src1Val);
    }
    if (_profiledValueType->prePassLoop == (Loop *)0x0) {
      if (pVVar20 != (Value *)0x0) {
        valueInfo = pVVar20->valueInfo;
        pSVar8 = valueInfo->symStore;
        if ((pSVar8 == (Sym *)0x0) || (pSVar8->m_kind != SymKindStack)) {
          bVar10 = IR::Opnd::IsRegOpnd((Opnd *)pGVar27);
          if (!bVar10) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            local_58 = (Value *)__tls_get_addr(&PTR_013e5f18);
            local_58->valueNumber = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                ,0x1336,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
            if (!bVar10) {
LAB_0042a898:
              pcVar9 = (code *)invalidInstructionException();
              (*pcVar9)();
            }
            local_58->valueNumber = 0;
          }
          pRVar22 = IR::Opnd::AsRegOpnd((Opnd *)pGVar27);
          SetSymStoreDirect(_profiledValueType,valueInfo,&pRVar22->m_sym->super_Sym);
        }
      }
      if (pVVar20 != src1Val) {
        GlobOptBlockData::SetValue
                  (&_profiledValueType->currentBlock->globOptData,pVVar20,(*ppIVar32)->m_src1);
      }
    }
    goto LAB_0042a471;
  case StFld:
  case StRootFld:
  case StFldStrict:
  case StRootFldStrict:
  case InitFld:
switchD_0042945f_caseD_70:
    bVar10 = DoFieldCopyProp(this);
    if (!bVar10 || src1Val == (Value *)0x0) {
      return (Value *)0x0;
    }
    if (pVVar20 != (Value *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar25 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                          ,0x1361,"(!src2Val)","Bad src Values...");
      if (!bVar10) goto LAB_0042a898;
      *puVar25 = 0;
    }
    if ((pSVar19->super_Sym).m_kind != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar25 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                          ,0x1363,"(sym->IsPropertySym())","sym->IsPropertySym()");
      if (!bVar10) goto LAB_0042a898;
      *puVar25 = 0;
    }
    ppIVar32 = ppIStack_48;
    pVVar20 = _max2;
    i = (pSVar19->super_Sym).m_id;
    uVar3 = (*ppIStack_48)->m_opcode;
    if ((1 < (ushort)(uVar3 - 0x1f7)) &&
       (BVar12 = BVSparse<Memory::JitArenaAllocator>::Test
                           ((_profiledValueType->currentBlock->globOptData).liveFields,i),
       BVar12 != '\0')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar25 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                          ,0x1365,
                          "(instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId))"
                          ,
                          "instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId)"
                         );
      if (!bVar10) goto LAB_0042a898;
      *puVar25 = 0;
    }
    pGVar28 = _profiledValueType;
    BVSparse<Memory::JitArenaAllocator>::Set
              ((_profiledValueType->currentBlock->globOptData).liveFields,i);
    if ((pGVar28->prePassLoop == (Loop *)0x0) &&
       ((*(undefined1 *)((long)((ValueType *)&pGVar27->byteCodeConstantValueNumbersBv + 1) + 1) & 4)
        != 0)) {
      pSVar17 = IR::Opnd::AsSymOpnd((Opnd *)pGVar27);
      EndFieldLifetime(pGVar28,pSVar17);
    }
    pIVar26 = *ppIVar32;
    goto LAB_0042a469;
  default:
    switch(OVar2) {
    case Ld_I4:
    case LdAsmJsFunc:
      goto switchD_0042945f_caseD_45;
    case LdC_A_I4:
    case LdC_A_R8:
    case ArgIn_A:
      pVVar20 = src1Val;
      goto LAB_0042a471;
    case LdC_F8_R8:
    case LdIndir:
    case NewClassProto:
    case NewClassConstructor:
    case ArgIn_Rest:
    case ArgOut_A_Inline:
    case ArgOut_A_InlineBuiltIn:
    case ArgOut_A_InlineSpecialized:
    case ArgOut_A_Dynamic:
    case ArgOut_A_FromStackArgs:
    case ArgOut_A_FixupForStackArgs:
    case ArgOut_A_SpreadArg:
    case LdMethodFldPolyInlineMiss:
      goto switchD_0042945f_caseD_28;
    case LdMethodFromFlags:
    case LdSlotArr:
      goto switchD_0042945f_caseD_5e;
    case StSlot:
    case StSlotChkUndecl:
      goto switchD_0042945f_caseD_70;
    }
    switch(OVar2) {
    case InitLocalClosure:
      pOVar29 = pIVar26->m_dst;
      if (pOVar29 == (Opnd *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar25 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                            ,0x14be,"(instr->GetDst())","instr->GetDst()");
        if (!bVar10) goto LAB_0042a898;
        *puVar25 = 0;
        pOVar29 = (*ppIVar32)->m_dst;
      }
      bVar10 = IR::Opnd::IsRegOpnd(pOVar29);
      if (!bVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar25 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                            ,0x14bf,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()")
        ;
        if (!bVar10) goto LAB_0042a898;
        *puVar25 = 0;
      }
      pRVar22 = IR::Opnd::AsRegOpnd((*ppIVar32)->m_dst);
      pSVar19 = pRVar22->m_sym;
      if (pSVar19 == (StackSym *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar25 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                            ,0x14c2,"(opndStackSym != nullptr)","opndStackSym != nullptr");
        if (!bVar10) goto LAB_0042a898;
        *puVar25 = 0;
      }
      pOVar6 = pSVar19->m_objectInfo;
      if (pOVar6 == (ObjectSymInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar25 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                            ,0x14c4,"(objectSymInfo != nullptr)","objectSymInfo != nullptr");
        if (!bVar10) goto LAB_0042a898;
        *puVar25 = 0;
      }
      ppPVar31 = &pOVar6->m_propertySymList;
      while (pPVar7 = *ppPVar31, pPVar7 != (PropertySym *)0x0) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (_profiledValueType->slotSyms,(pPVar7->super_Sym).m_id);
        ppPVar31 = &pPVar7->m_nextInStackSymList;
      }
      break;
    case NewScopeSlotsWithoutPropIds:
    case InlineRuntimeTypeError:
    case InlineRuntimeReferenceError:
    case Unused:
    case NewConcatStrMultiBE:
    case SetConcatStrMultiItemBE:
    case CloneStr:
    case Coerce_Regex:
      break;
    case BrOnNotEmpty:
switchD_004298e9_caseD_220:
      bVar10 = IR::Opnd::IsRegOpnd((Opnd *)pGVar27);
      if (!bVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar25 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                            ,0x1497,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
        if (!bVar10) goto LAB_0042a898;
        *puVar25 = 0;
      }
      local_40._0_2_ = (((ValueType *)&pGVar27->byteCodeConstantValueNumbersBv)->field_0).bits;
      bVar10 = ValueType::IsString((ValueType *)local_40);
      if (!bVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar25 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                            ,0x1498,"(dst->GetValueType().IsString())",
                            "dst->GetValueType().IsString()");
        if (!bVar10) goto LAB_0042a898;
        *puVar25 = 0;
      }
      goto switchD_0042945f_caseD_2a;
    case LdStr:
      if (src1Val != (Value *)0x0) goto LAB_0042a476;
      pVVar20 = NewGenericValue(this,(ValueType)0x800,(Opnd *)pGVar27);
      goto LAB_0042a471;
    case Coerce_Str:
switchD_004298e9_caseD_228:
LAB_00429d65:
      ppIVar32 = ppIStack_48;
      local_40._0_2_ = (pIVar26->m_dst->m_valueType).field_0.bits;
      bVar10 = ValueType::IsString((ValueType *)local_40);
      if (!bVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar25 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                            ,0x12a2,"(instr->GetDst()->GetValueType().IsString())",
                            "Creator of this instruction should have set the type");
        if (!bVar10) goto LAB_0042a898;
        *puVar25 = 0;
      }
      ppIStack_48 = ppIVar32;
      if ((((*ppIVar32)->m_src2 != (Opnd *)0x0) && (this_02 != (GlobOpt *)0x0)) &&
         ((_profiledValueType->prePassLoop == (Loop *)0x0 &&
          (bVar10 = ValueType::IsString((ValueType *)&this_02->byteCodeConstantValueNumbersBv),
          bVar10)))) {
        IR::Instr::FreeSrc2(*ppIStack_48);
      }
    case Coerce_StrOrRegex:
      if (((this_02 != (GlobOpt *)0x0) && (_profiledValueType->prePassLoop == (Loop *)0x0)) &&
         (bVar10 = ValueType::IsString((ValueType *)&this_02->byteCodeConstantValueNumbersBv),
         bVar10)) {
        pIVar26 = *ppIStack_48;
        pIVar26->m_opcode = Ld_A;
LAB_00429e53:
        ppIVar32 = ppIStack_48;
        if ((_profiledValueType->prePassLoop == (Loop *)0x0) &&
           (bVar10 = IR::Opnd::IsRegOpnd(pIVar26->m_src1), bVar10)) {
          pRVar22 = IR::Opnd::AsRegOpnd((Opnd *)pGVar27);
          if (((pRVar22->m_sym->field_0x18 & 1) != 0) &&
             ((pRVar22->m_sym->field_5).m_instrDef != (Instr *)0x0)) {
            pRVar22 = IR::Opnd::AsRegOpnd((Opnd *)pGVar27);
            pSVar19 = pRVar22->m_sym;
            pRVar22 = IR::Opnd::AsRegOpnd((*ppIVar32)->m_src1);
            StackSym::CopySymAttrs(pSVar19,pRVar22->m_sym);
          }
        }
        if ((*ppIVar32)->m_kind == InstrKindProfiled) {
          pPVar23 = IR::Instr::AsProfiledInstr(*ppIVar32);
          local_40._0_2_ = (pPVar23->u).field_3.fldInfoData.f1;
          bVar10 = ValueType::IsLikelyInt((ValueType *)local_40);
          pGVar28 = _profiledValueType;
          if ((!bVar10) ||
             (((bVar10 = IR::Opnd::IsRegOpnd((Opnd *)pGVar27), !bVar10 ||
               (pRVar22 = IR::Opnd::AsRegOpnd((Opnd *)pGVar27),
               (pRVar22->m_sym->field_0x18 & 2) == 0)) &&
              ((bVar10 = IR::Opnd::IsRegOpnd((*ppIVar32)->m_src1), !bVar10 ||
               (pRVar22 = IR::Opnd::AsRegOpnd((*ppIVar32)->m_src1),
               (pRVar22->m_sym->field_0x18 & 2) == 0)))))) {
            if (this_02 == (GlobOpt *)0x0) {
LAB_0042a44b:
              src1Val = NewGenericValue(pGVar28,(ValueType)local_40._0_2_,(Opnd *)pGVar27);
              if (src1Val != (Value *)0x0) goto LAB_0042a476;
            }
            else {
              bVar10 = ValueType::IsUninitialized
                                 ((ValueType *)&this_02->byteCodeConstantValueNumbersBv);
              if (bVar10) {
                if (pGVar28->prePassLoop != (Loop *)0x0) goto LAB_0042a44b;
                *(undefined2 *)&this_02->byteCodeConstantValueNumbersBv = local_40._0_2_;
                IR::Opnd::SetValueType((*ppIVar32)->m_src1,(ValueType)local_40._0_2_);
              }
            }
          }
        }
        pIVar26 = *ppIVar32;
switchD_00429a9f_caseD_9a:
        pVVar20 = _max2;
        pGVar28 = _profiledValueType;
LAB_0042a469:
        pVVar20 = ValueNumberTransferDst(pGVar28,pIVar26,pVVar20);
LAB_0042a471:
        src1Val = pVVar20;
        if (src1Val != (Value *)0x0) {
LAB_0042a476:
          pVVar20 = GlobOptBlockData::SetValue
                              (&_profiledValueType->currentBlock->globOptData,src1Val,
                               (Opnd *)pGVar27);
          return pVVar20;
        }
      }
      break;
    case Conv_PrimStr:
      local_40._0_2_ = (pIVar26->m_dst->m_valueType).field_0.bits;
      bVar10 = ValueType::IsString((ValueType *)local_40);
      if (!bVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar25 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                            ,0x1296,"(instr->GetDst()->GetValueType().IsString())",
                            "Creator of this instruction should have set the type");
        if (!bVar10) goto LAB_0042a898;
        *puVar25 = 0;
      }
      if (((this_02 != (GlobOpt *)0x0) && (_profiledValueType->prePassLoop == (Loop *)0x0)) &&
         (bVar10 = ValueType::IsPrimitive((ValueType *)&this_02->byteCodeConstantValueNumbersBv),
         bVar10)) {
        pIVar26 = *ppIStack_48;
        pIVar26->m_opcode = Conv_Str;
        goto LAB_00429d65;
      }
      break;
    default:
      switch(OVar2) {
      case LdElemI_A:
        pVVar20 = ValueNumberLdElemDst(this,ppIStack_48,src1Val);
        pIVar24 = IR::Opnd::AsIndirOpnd((*ppIVar32)->m_src1);
        local_40._0_2_ = (pIVar24->m_baseOpnd->super_Opnd).m_valueType.field_0.bits;
        bVar10 = ValueType::IsLikelyNativeArray((ValueType *)local_40);
        if (!bVar10) {
          return pVVar20;
        }
        pIVar26 = *ppIVar32;
        if (pIVar26->m_dst->m_type != TyVar) {
          return pVVar20;
        }
        break;
      case ProfiledLdElemI_A:
      case ProfiledStElemI_A:
        goto switchD_0042945f_caseD_28;
      case LdMethodElem:
        aVar4.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::GetObject(Object);
        local_40._0_2_ = aVar4.field_0;
        VVar14 = ValueType::ToLikely((ValueType *)local_40);
        pVVar20 = NewGenericValue(_profiledValueType,VVar14,(Opnd *)pGVar27);
        ppIVar32 = ppIStack_48;
        pIVar24 = IR::Opnd::AsIndirOpnd((*ppIStack_48)->m_src1);
        local_40._0_2_ = (pIVar24->m_baseOpnd->super_Opnd).m_valueType.field_0.bits;
        bVar10 = ValueType::IsLikelyNativeArray((ValueType *)local_40);
        if (!bVar10) {
          return pVVar20;
        }
        pIVar26 = *ppIVar32;
        break;
      case StElemI_A:
      case StElemI_A_Strict:
        goto switchD_00429a9f_caseD_9a;
      default:
        switch(OVar2) {
        case LdLen_A:
          if (pIVar26->m_kind == InstrKindProfiled) {
            pPVar23 = IR::Instr::AsProfiledInstr(pIVar26);
            local_40._0_2_ = (pPVar23->u).field_3.fldInfoData.f1;
            bVar10 = ValueType::IsLikelyInt((ValueType *)local_40);
            if ((!bVar10) ||
               (pRVar22 = IR::Opnd::AsRegOpnd((Opnd *)pGVar27),
               (pRVar22->m_sym->field_0x18 & 2) == 0)) {
              aVar4.bits = (Type)local_40._0_4_;
              goto LAB_0042a49c;
            }
          }
          break;
        case ProfiledLdLen_A:
        case LdNaN:
        case LdInfinity:
        case LdTrue_ReuseLoc:
          break;
        case LdUndef:
          pVVar21 = &ValueType::Undefined;
          goto LAB_0042a1e1;
        case LdTrue:
        case LdFalse:
switchD_0042945f_caseD_3b:
          pVVar21 = &ValueType::Boolean;
          goto LAB_0042a1e1;
        default:
          if (OVar2 - 0x1cf < 4) goto switchD_0042945f_caseD_3b;
          if (OVar2 == CallI) {
            bVar10 = IR::Opnd::IsRegOpnd((Opnd *)pGVar27);
            if (!bVar10) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar25 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                  ,0x1439,"(dst->IsRegOpnd())","dst->IsRegOpnd()");
              if (!bVar10) goto LAB_0042a898;
              *puVar25 = 0;
            }
            pRVar22 = IR::Opnd::AsRegOpnd((Opnd *)pGVar27);
            aVar4 = (pRVar22->super_Opnd).m_valueType.field_0;
            goto LAB_0042a49c;
          }
          if (OVar2 == LdSlot) goto switchD_0042945f_caseD_5e;
          if (OVar2 == LdThis) {
            sourceContextId = Func::GetSourceContextId(this->func);
            functionId = Func::GetLocalFunctionId(this->func);
            bVar10 = Js::Phases::IsEnabled
                               ((Phases *)&DAT_01441eb0,OptTagChecksPhase,sourceContextId,functionId
                               );
            if ((!bVar10) &&
               ((this_02 == (GlobOpt *)0x0 ||
                (bVar10 = ValueType::IsUninitialized
                                    ((ValueType *)&this_02->byteCodeConstantValueNumbersBv), bVar10)
                ))) {
              VVar14 = ValueType::GetObject(Object);
              local_4c = CONCAT22(local_4c._2_2_,VVar14.field_0);
              local_40._0_2_ = ValueType::ToLikely((ValueType *)&local_4c);
              bVar10 = false;
              goto LAB_0042a502;
            }
            break;
          }
          if (OVar2 == IsInst) goto switchD_0042945f_caseD_3b;
          if (OVar2 == BrOnEmpty) goto switchD_004298e9_caseD_220;
          if (OVar2 == Conv_Str) goto switchD_004298e9_caseD_228;
          if (OVar2 == InitComputedProperty) goto switchD_0042945f_caseD_70;
          if (OVar2 != BytecodeArgOutCapture) {
            if (OVar2 == CheckFixedFld) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar25 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar25 = 1;
              bVar10 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                  ,0x12fd,"(false)",
                                  "CheckFixedFld doesn\'t have a dst, so we should never get here");
              if (!bVar10) goto LAB_0042a898;
              *puVar25 = 0;
            }
            else if ((OVar2 == ExtendArg_A) && (bVar10 = DoCSE(this), bVar10)) {
              pBVar5 = _profiledValueType->currentBlock;
              pSVar19 = IR::Opnd::GetStackSym((*ppIVar32)->m_dst);
              pVVar20 = GlobOptBlockData::FindValue(&pBVar5->globOptData,&pSVar19->super_Sym);
              if (pVVar20 != (Value *)0x0) {
                return pVVar20;
              }
            }
            break;
          }
          goto LAB_00429e53;
        }
        goto switchD_0042945f_caseD_28;
      }
      if ((pIVar26->field_0x38 & 0x10) == 0) {
        return pVVar20;
      }
      BVar15 = IR::Instr::GetBailOutKind(pIVar26);
      bailOutKind = BVar15 - BailOutOnArrayAccessHelperCall;
      if ((BVar15 >> 0x11 & 1) == 0) {
        bailOutKind = BVar15;
      }
      if ((bailOutKind != BailOutInvalid) && (bailOutKind != BailOutOnImplicitCallsPreOp)) {
        IR::Instr::SetBailOutKind(*ppIVar32,bailOutKind);
        return pVVar20;
      }
      IR::Instr::ClearBailOutInfo(*ppIVar32);
      return pVVar20;
    }
switchD_0042945f_caseD_28:
    aVar4.bits = (Type)*(undefined4 *)&pGVar27->byteCodeConstantValueNumbersBv;
    goto LAB_0042a49c;
  }
LAB_0042a1e1:
  aVar4 = (anon_union_2_4_ea848c7b_for_ValueType_13)pVVar21->field_0;
LAB_0042a49c:
  pVVar20 = NewGenericValue(_profiledValueType,(ValueType)aVar4.field_0,(Opnd *)pGVar27);
  return pVVar20;
}

Assistant:

Value *
GlobOpt::ValueNumberDst(IR::Instr **pInstr, Value *src1Val, Value *src2Val)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *dst = instr->GetDst();
    Value *dstVal = nullptr;
    Sym *sym;

    if (instr->CallsSetter())
    {
        return nullptr;
    }
    if (dst == nullptr)
    {
        return nullptr;
    }

    switch (dst->GetKind())
    {
    case IR::OpndKindSym:
        sym = dst->AsSymOpnd()->m_sym;
        break;

    case IR::OpndKindReg:
        sym = dst->AsRegOpnd()->m_sym;

        if (OpCodeAttr::TempNumberProducing(instr->m_opcode))
        {
            CurrentBlockData()->isTempSrc->Set(sym->m_id);
        }
        else if (OpCodeAttr::TempNumberTransfer(instr->m_opcode))
        {
            IR::Opnd *src1 = instr->GetSrc1();

            if (src1->IsRegOpnd() && CurrentBlockData()->isTempSrc->Test(src1->AsRegOpnd()->m_sym->m_id))
            {
                StackSym *src1Sym = src1->AsRegOpnd()->m_sym;
                // isTempSrc is used for marking isTempLastUse, which is used to generate AddLeftDead()
                // calls instead of the normal Add helpers. It tells the runtime that concats can use string
                // builders.
                // We need to be careful in the case where src1 points to a string builder and is getting aliased.
                // Clear the bit on src and dst of the transfer instr in this case, unless we can prove src1
                // isn't pointing at a string builder, like if it is single def and the def instr is not an Add,
                // but TempProducing.
                if (src1Sym->IsSingleDef() && src1Sym->m_instrDef->m_opcode != Js::OpCode::Add_A
                    && OpCodeAttr::TempNumberProducing(src1Sym->m_instrDef->m_opcode))
                {
                    CurrentBlockData()->isTempSrc->Set(sym->m_id);
                }
                else
                {
                    CurrentBlockData()->isTempSrc->Clear(src1->AsRegOpnd()->m_sym->m_id);
                    CurrentBlockData()->isTempSrc->Clear(sym->m_id);
                }
            }
            else
            {
                CurrentBlockData()->isTempSrc->Clear(sym->m_id);
            }
        }
        else
        {
            CurrentBlockData()->isTempSrc->Clear(sym->m_id);
        }
        break;

    case IR::OpndKindIndir:
        return nullptr;

    default:
        return nullptr;
    }

    int32 min1, max1, min2, max2, newMin, newMax;
    ValueInfo *src1ValueInfo = (src1Val ? src1Val->GetValueInfo() : nullptr);
    ValueInfo *src2ValueInfo = (src2Val ? src2Val->GetValueInfo() : nullptr);

    switch (instr->m_opcode)
    {
    case Js::OpCode::Conv_PrimStr:
        AssertMsg(instr->GetDst()->GetValueType().IsString(),
            "Creator of this instruction should have set the type");
        if (this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsPrimitive())
        {
            break;
        }
        instr->m_opcode = Js::OpCode::Conv_Str;
        // fall-through
    case Js::OpCode::Conv_Str:
    // This opcode is commented out since we don't track regex information in GlobOpt now.
    //case Js::OpCode::Coerce_Regex:
    case Js::OpCode::Coerce_Str:
        AssertMsg(instr->GetDst()->GetValueType().IsString(),
            "Creator of this instruction should have set the type");

        // Due to fall through and the fact that Ld_A only takes one source,
        // free the other source here.
        if (instr->GetSrc2() && !(this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsString()))
        {
            instr->FreeSrc2();
        }

        // fall-through
    case Js::OpCode::Coerce_StrOrRegex:
        // We don't set the ValueType of src1 for Coerce_StrOrRegex, hence skip the ASSERT
        if (this->IsLoopPrePass() || src1ValueInfo == nullptr || !src1ValueInfo->IsString())
        {
            break;
        }
        instr->m_opcode = Js::OpCode::Ld_A;
        // fall-through

    case Js::OpCode::BytecodeArgOutCapture:
    case Js::OpCode::LdAsmJsFunc:
    case Js::OpCode::Ld_A:
    case Js::OpCode::Ld_I4:

        // Propagate sym attributes across the reg copy.
        if (!this->IsLoopPrePass() && instr->GetSrc1()->IsRegOpnd())
        {
            if (dst->AsRegOpnd()->m_sym->IsSingleDef())
            {
                dst->AsRegOpnd()->m_sym->CopySymAttrs(instr->GetSrc1()->AsRegOpnd()->m_sym);
            }
        }

        if (instr->IsProfiledInstr())
        {
            const ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(
                    profiledValueType.IsLikelyInt() &&
                    (
                        (dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber) ||
                        (instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->AsRegOpnd()->m_sym->m_isNotNumber)
                    )
                ))
            {
                if(!src1ValueInfo)
                {
                    dstVal = this->NewGenericValue(profiledValueType, dst);
                }
                else if(src1ValueInfo->IsUninitialized())
                {
                    if(IsLoopPrePass())
                    {
                        dstVal = this->NewGenericValue(profiledValueType, dst);
                    }
                    else
                    {
                        // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                        // can improve the original value type.
                        src1ValueInfo->Type() = profiledValueType;
                        instr->GetSrc1()->SetValueType(profiledValueType);
                    }
                }
            }
        }

        if (dstVal == nullptr)
        {
            // Ld_A is just transferring the value
            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }

        break;

    case Js::OpCode::ExtendArg_A:
    {
        // SIMD_JS
        // We avoid transforming EAs to Lds to keep the IR shape consistent and avoid CSEing of EAs.
        // CSEOptimize only assigns a Value to the EA dst, and doesn't turn it to a Ld. If this happened, we shouldn't assign a new Value here.
        if (DoCSE())
        {
            IR::Opnd * currDst = instr->GetDst();
            Value * currDstVal = CurrentBlockData()->FindValue(currDst->GetStackSym());
            if (currDstVal != nullptr)
            {
                return currDstVal;
            }
        }
        break;
    }

    case Js::OpCode::CheckFixedFld:
        AssertMsg(false, "CheckFixedFld doesn't have a dst, so we should never get here");
        break;

    case Js::OpCode::LdSlot:
    case Js::OpCode::LdSlotArr:
    case Js::OpCode::LdFld:
    case Js::OpCode::LdFldForTypeOf:
    case Js::OpCode::LdFldForCallApplyTarget:
    // Do not transfer value type on LdRootFldForTypeOf to prevent copy-prop to LdRootFld in case the field doesn't exist since LdRootFldForTypeOf does not throw.
    // Same goes for ScopedLdFldForTypeOf as we'll end up loading the property from the root object if the property is not in the scope chain.
    //case Js::OpCode::LdRootFldForTypeOf:
    //case Js::OpCode::ScopedLdFldForTypeOf:
    case Js::OpCode::LdRootFld:
    case Js::OpCode::LdMethodFld:
    case Js::OpCode::LdRootMethodFld:
    case Js::OpCode::ScopedLdMethodFld:
    case Js::OpCode::LdMethodFromFlags:
    case Js::OpCode::ScopedLdFld:
        if (instr->IsProfiledInstr())
        {
            ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(profiledValueType.IsLikelyInt() && dst->IsRegOpnd() && dst->AsRegOpnd()->m_sym->m_isNotNumber))
            {
                if(!src1ValueInfo)
                {
                    dstVal = this->NewGenericValue(profiledValueType, dst);
                }
                else if(src1ValueInfo->IsUninitialized())
                {
                    if(IsLoopPrePass() && (!dst->IsRegOpnd() || !dst->AsRegOpnd()->m_sym->IsSingleDef()))
                    {
                        dstVal = this->NewGenericValue(profiledValueType, dst);
                    }
                    else
                    {
                        // Assuming the profile data gives more precise value types based on the path it took at runtime, we
                        // can improve the original value type.
                        src1ValueInfo->Type() = profiledValueType;
                        instr->GetSrc1()->SetValueType(profiledValueType);
                    }
                }
            }
        }
        if (dstVal == nullptr)
        {
            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }

        if(!this->IsLoopPrePass())
        {
            // We cannot transfer value if the field hasn't been copy prop'd because we don't generate
            // an implicit call bailout between those values if we don't have "live fields" unless, we are hoisting the field.
            ValueInfo *dstValueInfo = (dstVal ? dstVal->GetValueInfo() : nullptr);

            // Update symStore if it isn't a stackSym
            if (dstVal && (!dstValueInfo->GetSymStore() || !dstValueInfo->GetSymStore()->IsStackSym()))
            {
                Assert(dst->IsRegOpnd());
                this->SetSymStoreDirect(dstValueInfo, dst->AsRegOpnd()->m_sym);
            }
            if (src1Val != dstVal)
            {
                CurrentBlockData()->SetValue(dstVal, instr->GetSrc1());
            }
        }
        break;

    case Js::OpCode::LdC_A_R8:
    case Js::OpCode::LdC_A_I4:
    case Js::OpCode::ArgIn_A:
        dstVal = src1Val;
        break;

    case Js::OpCode::LdStr:
        if (src1Val == nullptr)
        {
            src1Val = NewGenericValue(ValueType::String, dst);
        }
        dstVal = src1Val;
        break;

    // LdElemUndef only assign undef if the field doesn't exist.
    // So we don't actually know what the value is, so we can't really copy prop it.
    //case Js::OpCode::LdElemUndef:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::InitFld:
    case Js::OpCode::InitComputedProperty:
        if (DoFieldCopyProp())
        {
            if (src1Val == nullptr)
            {
                // src1 may have no value if it's not a valid var, e.g., NULL for let/const initialization.
                // Consider creating generic values for such things.
                return nullptr;
            }
            AssertMsg(!src2Val, "Bad src Values...");

            Assert(sym->IsPropertySym());
            SymID symId = sym->m_id;
            Assert(instr->m_opcode == Js::OpCode::StSlot || instr->m_opcode == Js::OpCode::StSlotChkUndecl || !CurrentBlockData()->liveFields->Test(symId));

            CurrentBlockData()->liveFields->Set(symId);
            if (!this->IsLoopPrePass() && dst->GetIsDead())
            {
                // Take the property sym out of the live fields set (with special handling for loops).
                this->EndFieldLifetime(dst->AsSymOpnd());
            }

            dstVal = this->ValueNumberTransferDst(instr, src1Val);
        }
        else
        {
            return nullptr;
        }
        break;

    case Js::OpCode::Conv_Num:
        if(src1ValueInfo->IsNumber())
        {
            dstVal = ValueNumberTransferDst(instr, src1Val);
        }
        else
        {
            return NewGenericValue(src1ValueInfo->Type().ToDefiniteAnyNumber().SetCanBeTaggedValue(true), dst);
        }
        break;

    case Js::OpCode::Not_A:
    {
        if (!src1Val || !src1ValueInfo->GetIntValMinMax(&min1, &max1, this->DoAggressiveIntTypeSpec()))
        {
            min1 = INT32_MIN;
            max1 = INT32_MAX;
        }

        this->PropagateIntRangeForNot(min1, max1, &newMin, &newMax);
        return CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, src2Val);
    }

    case Js::OpCode::Xor_A:
    case Js::OpCode::Or_A:
    case Js::OpCode::And_A:
    case Js::OpCode::Shl_A:
    case Js::OpCode::Shr_A:
    case Js::OpCode::ShrU_A:
    {
        if (!src1Val || !src1ValueInfo->GetIntValMinMax(&min1, &max1, this->DoAggressiveIntTypeSpec()))
        {
            min1 = INT32_MIN;
            max1 = INT32_MAX;
        }
        if (!src2Val || !src2ValueInfo->GetIntValMinMax(&min2, &max2, this->DoAggressiveIntTypeSpec()))
        {
            min2 = INT32_MIN;
            max2 = INT32_MAX;
        }

        if (instr->m_opcode == Js::OpCode::ShrU_A &&
            min1 < 0 &&
            IntConstantBounds(min2, max2).And_0x1f().Contains(0))
        {
            // Src1 may be too large to represent as a signed int32, and src2 may be zero.
            // Since the result can therefore be too large to represent as a signed int32,
            // include Number in the value type.
            return CreateDstUntransferredValue(
                ValueType::AnyNumber.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
        }

        this->PropagateIntRangeBinary(instr, min1, max1, min2, max2, &newMin, &newMax);
        return CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, src2Val);
    }

    case Js::OpCode::Incr_A:
    case Js::OpCode::Decr_A:
    {
        ValueType valueType;
        if(src1Val)
        {
            valueType = src1Val->GetValueInfo()->Type().ToDefiniteAnyNumber();
        }
        else
        {
            valueType = ValueType::Number;
        }
        return CreateDstUntransferredValue(valueType.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
    }

    case Js::OpCode::Add_A:
    {
        ValueType valueType;
        if (src1Val && src1ValueInfo->IsLikelyNumber() && src2Val && src2ValueInfo->IsLikelyNumber())
        {
            if(src1ValueInfo->IsLikelyInt() && src2ValueInfo->IsLikelyInt())
            {
                // When doing aggressiveIntType, just assume the result is likely going to be int
                // if both input is int.
                const bool isLikelyTagged = src1ValueInfo->IsLikelyTaggedInt() && src2ValueInfo->IsLikelyTaggedInt();
                if(src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
                {
                    // If both of them are numbers then we can definitely say that the result is a number.
                    valueType = ValueType::GetNumberAndLikelyInt(isLikelyTagged);
                }
                else
                {
                    // This is only likely going to be int but can be a string as well.
                    valueType = ValueType::GetInt(isLikelyTagged).ToLikely();
                }
            }
            else
            {
                // We can only be certain of any thing if both of them are numbers.
                // Otherwise, the result could be string.
                if (src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
                {
                    if (src1ValueInfo->IsFloat() || src2ValueInfo->IsFloat())
                    {
                        // If one of them is a float, the result probably is a float instead of just int
                        // but should always be a number.
                        valueType = ValueType::Float.SetCanBeTaggedValue(true);
                    }
                    else
                    {
                        // Could be int, could be number
                        valueType = ValueType::Number.SetCanBeTaggedValue(true);
                    }
                }
                else if (src1ValueInfo->IsLikelyFloat() || src2ValueInfo->IsLikelyFloat())
                {
                    // Result is likely a float (but can be anything)
                    valueType = ValueType::Float.ToLikely();
                }
                else
                {
                    // Otherwise it is a likely int or float (but can be anything)
                    valueType = ValueType::Number.ToLikely();
                }
            }
        }
        else if((src1Val && src1ValueInfo->IsString()) || (src2Val && src2ValueInfo->IsString()))
        {
            // String + anything should always result in a string
            valueType = ValueType::String;
        }
        else if((src1Val && src1ValueInfo->IsNotString() && src1ValueInfo->IsPrimitive())
            && (src2Val && src2ValueInfo->IsNotString() && src2ValueInfo->IsPrimitive()))
        {
            // If src1 and src2 are not strings and primitive, add should yield a number.
            valueType = ValueType::Number.SetCanBeTaggedValue(true);
        }
        else if((src1Val && src1ValueInfo->IsLikelyString()) || (src2Val && src2ValueInfo->IsLikelyString()))
        {
            // likelystring + anything should always result in a likelystring
            valueType = ValueType::String.ToLikely();
        }
        else
        {
            // Number or string. Could make the value a merge of Number and String, but Uninitialized is more useful at the moment.
            Assert(valueType.IsUninitialized());
        }

        return CreateDstUntransferredValue(valueType, instr, src1Val, src2Val);
    }

    case Js::OpCode::Div_A:
        {
            ValueType divValueType = GetDivValueType(instr, src1Val, src2Val, false);
            if (divValueType.IsLikelyInt() || divValueType.IsFloat())
            {
                return CreateDstUntransferredValue(divValueType.SetCanBeTaggedValue(true), instr, src1Val, src2Val);
            }
        }
        // fall-through

    case Js::OpCode::Sub_A:
    case Js::OpCode::Mul_A:
    case Js::OpCode::Rem_A:
    {
        ValueType valueType;
        if( src1Val &&
            src1ValueInfo->IsLikelyInt() &&
            src2Val &&
            src2ValueInfo->IsLikelyInt() &&
            instr->m_opcode != Js::OpCode::Div_A)
        {
            const bool isLikelyTagged =
                src1ValueInfo->IsLikelyTaggedInt() && (src2ValueInfo->IsLikelyTaggedInt() || instr->m_opcode == Js::OpCode::Rem_A);
            if(src1ValueInfo->IsNumber() && src2ValueInfo->IsNumber())
            {
                valueType = ValueType::GetNumberAndLikelyInt(isLikelyTagged);
            }
            else
            {
                valueType = ValueType::GetInt(isLikelyTagged).ToLikely();
            }
        }
        else if ((src1Val && src1ValueInfo->IsLikelyFloat()) || (src2Val && src2ValueInfo->IsLikelyFloat()))
        {
            // This should ideally be NewNumberAndLikelyFloatValue since we know the result is a number but not sure if it will
            // be a float value. However, that Number/LikelyFloat value type doesn't exist currently and all the necessary
            // checks are done for float values (tagged int checks, etc.) so it's sufficient to just create a float value here.
            valueType = ValueType::Float.SetCanBeTaggedValue(true);
        }
        else
        {
            valueType = ValueType::Number.SetCanBeTaggedValue(true);
        }

        return CreateDstUntransferredValue(valueType, instr, src1Val, src2Val);
    }

    case Js::OpCode::CallI:
        Assert(dst->IsRegOpnd());
        return NewGenericValue(dst->AsRegOpnd()->GetValueType(), dst);

    case Js::OpCode::LdElemI_A:
    {
        dstVal = ValueNumberLdElemDst(pInstr, src1Val);
        const ValueType baseValueType(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType());
        if( (
                baseValueType.IsLikelyNativeArray() ||
            #ifdef _M_IX86
                (
                    !AutoSystemInfo::Data.SSE2Available() &&
                    baseValueType.IsLikelyObject() &&
                    (
                        baseValueType.GetObjectType() == ObjectType::Float32Array ||
                        baseValueType.GetObjectType() == ObjectType::Float64Array
                    )
                )
            #else
                false
            #endif
            ) &&
            instr->GetDst()->IsVar() &&
            instr->HasBailOutInfo())
        {
            // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
            // path. Note that the removed bailouts should not be necessary for correctness.
            IR::BailOutKind bailOutKind = instr->GetBailOutKind();
            if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
            {
                bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
            }
            if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
            {
                bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
            }
            if(bailOutKind)
            {
                instr->SetBailOutKind(bailOutKind);
            }
            else
            {
                instr->ClearBailOutInfo();
            }
        }
        return dstVal;
    }

    case Js::OpCode::LdMethodElem:
        // Not worth profiling this, just assume it's likely object (should be likely function but ValueType does not track
        // functions currently, so using ObjectType::Object instead)
        dstVal = NewGenericValue(ValueType::GetObject(ObjectType::Object).ToLikely(), dst);
        if(instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyNativeArray() && instr->HasBailOutInfo())
        {
            // The lowerer is not going to generate a fast path for this case. Remove any bailouts that require the fast
            // path. Note that the removed bailouts should not be necessary for correctness.
            IR::BailOutKind bailOutKind = instr->GetBailOutKind();
            if(bailOutKind & IR::BailOutOnArrayAccessHelperCall)
            {
                bailOutKind -= IR::BailOutOnArrayAccessHelperCall;
            }
            if(bailOutKind == IR::BailOutOnImplicitCallsPreOp)
            {
                bailOutKind -= IR::BailOutOnImplicitCallsPreOp;
            }
            if(bailOutKind)
            {
                instr->SetBailOutKind(bailOutKind);
            }
            else
            {
                instr->ClearBailOutInfo();
            }
        }
        return dstVal;

    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
        dstVal = this->ValueNumberTransferDst(instr, src1Val);
        break;

    case Js::OpCode::LdLen_A:
        if (instr->IsProfiledInstr())
        {
            const ValueType profiledValueType(instr->AsProfiledInstr()->u.FldInfo().valueType);
            if(!(profiledValueType.IsLikelyInt() && dst->AsRegOpnd()->m_sym->m_isNotNumber))
            {
                return this->NewGenericValue(profiledValueType, dst);
            }
        }
        break;

    case Js::OpCode::BrOnEmpty:
    case Js::OpCode::BrOnNotEmpty:
        Assert(dst->IsRegOpnd());
        Assert(dst->GetValueType().IsString());
        return this->NewGenericValue(ValueType::String, dst);

    case Js::OpCode::IsInst:
    case Js::OpCode::LdTrue:
    case Js::OpCode::LdFalse:
    case Js::OpCode::CmEq_A:
    case Js::OpCode::CmSrEq_A:
    case Js::OpCode::CmNeq_A:
    case Js::OpCode::CmSrNeq_A:
    case Js::OpCode::CmLe_A:
    case Js::OpCode::CmUnLe_A:
    case Js::OpCode::CmLt_A:
    case Js::OpCode::CmUnLt_A:
    case Js::OpCode::CmGe_A:
    case Js::OpCode::CmUnGe_A:
    case Js::OpCode::CmGt_A:
    case Js::OpCode::CmUnGt_A:
        return this->NewGenericValue(ValueType::Boolean, dst);

    case Js::OpCode::LdUndef:
        return this->NewGenericValue(ValueType::Undefined, dst);

    case Js::OpCode::LdC_A_Null:
        return this->NewGenericValue(ValueType::Null, dst);

    case Js::OpCode::LdThis:
        if (!PHASE_OFF(Js::OptTagChecksPhase, this->func) &&
            (src1ValueInfo == nullptr || src1ValueInfo->IsUninitialized()))
        {
            return this->NewGenericValue(ValueType::GetObject(ObjectType::Object).ToLikely().SetCanBeTaggedValue(false), dst);
        }
        break;

    case Js::OpCode::Typeof:
    case Js::OpCode::TypeofElem:
        return this->NewGenericValue(ValueType::String, dst);
    case Js::OpCode::InitLocalClosure:
        Assert(instr->GetDst());
        Assert(instr->GetDst()->IsRegOpnd());
        IR::RegOpnd *regOpnd = instr->GetDst()->AsRegOpnd();
        StackSym *opndStackSym = regOpnd->m_sym;
        Assert(opndStackSym != nullptr);
        ObjectSymInfo *objectSymInfo = opndStackSym->m_objectInfo;
        Assert(objectSymInfo != nullptr);
        for (PropertySym *localVarSlotList = objectSymInfo->m_propertySymList; localVarSlotList; localVarSlotList = localVarSlotList->m_nextInStackSymList)
        {
            this->slotSyms->Set(localVarSlotList->m_id);
        }
        break;
    }

    if (dstVal == nullptr)
    {
        return this->NewGenericValue(dst->GetValueType(), dst);
    }

    return CurrentBlockData()->SetValue(dstVal, dst);
}